

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_sse2.c
# Opt level: O3

void aom_highbd_quantize_b_adaptive_sse2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  uint *puVar1;
  uint *puVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  bool bVar37;
  int iVar38;
  short *psVar39;
  ulong uVar40;
  int *piVar41;
  bool bVar42;
  long lVar43;
  ushort uVar44;
  uint uVar45;
  ushort uVar47;
  ushort uVar48;
  uint uVar49;
  ushort uVar50;
  ushort uVar51;
  uint uVar52;
  ushort uVar53;
  ushort uVar54;
  uint uVar55;
  undefined1 auVar46 [16];
  ushort uVar56;
  int iVar58;
  undefined1 auVar57 [16];
  int iVar59;
  ushort uVar60;
  int iVar61;
  ushort uVar69;
  ushort uVar70;
  int iVar71;
  ushort uVar72;
  int iVar73;
  int iVar74;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  int iVar101;
  undefined1 auVar94 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  uint uVar126;
  uint uVar137;
  uint uVar138;
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  uint uVar139;
  uint uVar140;
  uint uVar142;
  uint uVar143;
  undefined1 auVar141 [16];
  uint uVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  int iVar147;
  int iVar150;
  int iVar151;
  int iVar152;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  uint uVar156;
  uint uVar157;
  uint uVar161;
  uint uVar163;
  uint uVar165;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  uint uVar162;
  uint uVar164;
  uint uVar166;
  undefined1 auVar160 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 local_168 [16];
  int local_158;
  int aiStack_154 [57];
  int thresh [4];
  __m128i sign_hi_4;
  __m128i sign_lo_4;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  
  lVar43 = 0;
  piVar41 = &local_158;
  bVar37 = true;
  do {
    bVar42 = bVar37;
    *piVar41 = (dequant_ptr[lVar43] * 0x145 + 0x40 >> 7) + zbin_ptr[lVar43] * 0x20 + -1;
    lVar43 = 1;
    piVar41 = aiStack_154;
    bVar37 = false;
  } while (bVar42);
  auVar46 = *(undefined1 (*) [16])zbin_ptr;
  auVar68 = *(undefined1 (*) [16])round_ptr;
  auVar64 = *(undefined1 (*) [16])quant_ptr;
  auVar81 = *(undefined1 (*) [16])dequant_ptr;
  auVar97 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar57 = psraw(auVar46,0xf);
  auVar167._0_12_ = auVar46._0_12_;
  auVar167._12_2_ = auVar46._6_2_;
  auVar167._14_2_ = auVar57._6_2_;
  auVar141._12_4_ = auVar167._12_4_;
  auVar141._0_10_ = auVar46._0_10_;
  auVar141._10_2_ = auVar57._4_2_;
  auVar102._10_6_ = auVar141._10_6_;
  auVar102._0_8_ = auVar46._0_8_;
  auVar102._8_2_ = auVar46._4_2_;
  auVar32._4_8_ = auVar102._8_8_;
  auVar32._2_2_ = auVar57._2_2_;
  auVar32._0_2_ = auVar46._2_2_;
  iVar58 = auVar102._8_4_ + -1;
  iVar59 = auVar141._12_4_ + -1;
  uVar45 = *coeff_ptr >> 0x1f;
  uVar49 = coeff_ptr[1] >> 0x1f;
  uVar52 = coeff_ptr[2] >> 0x1f;
  uVar55 = coeff_ptr[3] >> 0x1f;
  uVar156 = coeff_ptr[4] >> 0x1f;
  uVar161 = coeff_ptr[5] >> 0x1f;
  uVar163 = coeff_ptr[6] >> 0x1f;
  uVar165 = coeff_ptr[7] >> 0x1f;
  iVar147 = (*coeff_ptr ^ uVar45) - uVar45;
  iVar150 = (coeff_ptr[1] ^ uVar49) - uVar49;
  iVar151 = (coeff_ptr[2] ^ uVar52) - uVar52;
  iVar152 = (coeff_ptr[3] ^ uVar55) - uVar55;
  iVar61 = (coeff_ptr[4] ^ uVar156) - uVar156;
  iVar71 = (coeff_ptr[5] ^ uVar161) - uVar161;
  iVar73 = (coeff_ptr[6] ^ uVar163) - uVar163;
  iVar74 = (coeff_ptr[7] ^ uVar165) - uVar165;
  auVar172._0_4_ = -(uint)(local_158 < iVar147 * 0x20);
  auVar172._4_4_ = -(uint)(aiStack_154[0] < iVar150 * 0x20);
  auVar172._8_4_ = -(uint)(aiStack_154[0] < iVar151 * 0x20);
  auVar172._12_4_ = -(uint)(aiStack_154[0] < iVar152 * 0x20);
  auVar103._0_4_ = -(uint)(aiStack_154[0] < iVar61 * 0x20);
  auVar103._4_4_ = -(uint)(aiStack_154[0] < iVar71 * 0x20);
  auVar103._8_4_ = -(uint)(aiStack_154[0] < iVar73 * 0x20);
  auVar103._12_4_ = -(uint)(aiStack_154[0] < iVar74 * 0x20);
  auVar102 = packssdw(auVar172,auVar103);
  local_168 = (undefined1  [16])0x0;
  bVar23 = (auVar102 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar24 = (auVar102 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar22 = (auVar102 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar21 = (auVar102 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar20 = (auVar102 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar19 = (auVar102 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar18 = (auVar102 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar17 = (auVar102 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar16 = (auVar102 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar15 = (auVar102 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar14 = (auVar102 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar13 = (auVar102 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar12 = (auVar102 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar11 = (auVar102 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar42 = (auVar102 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
  bVar37 = auVar102[0xf] < '\0';
  if (((((((((((((((bVar23 || bVar24) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) ||
             bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) || bVar42) ||
      bVar37) {
    local_168 = auVar102 & *(undefined1 (*) [16])iscan;
  }
  bVar37 = ((((((((((((((bVar23 || bVar24) || bVar22) || bVar21) || bVar20) || bVar19) || bVar18) ||
                  bVar17) || bVar16) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11) ||
           bVar42) || bVar37;
  auVar141 = psraw(auVar68,0xf);
  auVar167 = psraw(auVar64,0xf);
  auVar172 = psraw(auVar81,0xf);
  auVar102 = psraw(auVar97,0xf);
  auVar153._0_4_ = -(uint)(CONCAT22(auVar57._0_2_,auVar46._0_2_) + -1 < iVar147);
  auVar153._4_4_ = -(uint)(auVar32._0_4_ + -1 < iVar150);
  auVar153._8_4_ = -(uint)(iVar58 < iVar151);
  auVar153._12_4_ = -(uint)(iVar59 < iVar152);
  auVar57._0_4_ = -(uint)(iVar58 < iVar61);
  auVar57._4_4_ = -(uint)(iVar59 < iVar71);
  auVar57._8_4_ = -(uint)(iVar58 < iVar73);
  auVar57._12_4_ = -(uint)(iVar59 < iVar74);
  auVar46 = packssdw(auVar153,auVar57);
  uVar47 = (ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
           (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
           (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
           (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
           (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
           (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
           (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
           (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
           (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
           (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
           (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
           (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
           (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
           (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar46[0xf] >> 7) << 0xf
  ;
  if (uVar47 == 0) {
    auVar46 = (undefined1  [16])0x0;
  }
  else {
    auVar46 = auVar46 & *(undefined1 (*) [16])iscan;
  }
  bVar42 = uVar47 != 0;
  auVar96._0_12_ = auVar68._0_12_;
  auVar96._12_2_ = auVar68._6_2_;
  auVar96._14_2_ = auVar141._6_2_;
  auVar95._12_4_ = auVar96._12_4_;
  auVar95._0_10_ = auVar68._0_10_;
  auVar95._10_2_ = auVar141._4_2_;
  auVar94._10_6_ = auVar95._10_6_;
  auVar94._0_8_ = auVar68._0_8_;
  auVar94._8_2_ = auVar68._4_2_;
  auVar33._4_8_ = auVar94._8_8_;
  auVar33._2_2_ = auVar141._2_2_;
  auVar33._0_2_ = auVar68._2_2_;
  auVar117._0_12_ = auVar64._0_12_;
  auVar117._12_2_ = auVar64._6_2_;
  auVar117._14_2_ = auVar167._6_2_;
  auVar116._12_4_ = auVar117._12_4_;
  auVar116._0_10_ = auVar64._0_10_;
  auVar116._10_2_ = auVar167._4_2_;
  auVar115._10_6_ = auVar116._10_6_;
  auVar115._0_8_ = auVar64._0_8_;
  auVar115._8_2_ = auVar64._4_2_;
  auVar34._4_8_ = auVar115._8_8_;
  auVar34._2_2_ = auVar167._2_2_;
  auVar34._0_2_ = auVar64._2_2_;
  auVar78._0_2_ = auVar64._0_2_;
  auVar78._2_2_ = auVar167._0_2_;
  auVar78._4_12_ = auVar34;
  auVar77._0_12_ = auVar81._0_12_;
  auVar77._12_2_ = auVar81._6_2_;
  auVar77._14_2_ = auVar172._6_2_;
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._0_10_ = auVar81._0_10_;
  auVar76._10_2_ = auVar172._4_2_;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._0_8_ = auVar81._0_8_;
  auVar75._8_2_ = auVar81._4_2_;
  auVar35._4_8_ = auVar75._8_8_;
  auVar35._2_2_ = auVar172._2_2_;
  auVar35._0_2_ = auVar81._2_2_;
  auVar64._0_2_ = auVar81._0_2_;
  auVar64._2_2_ = auVar172._0_2_;
  auVar64._4_12_ = auVar35;
  auVar129._0_12_ = auVar97._0_12_;
  auVar129._12_2_ = auVar97._6_2_;
  auVar129._14_2_ = auVar102._6_2_;
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._0_10_ = auVar97._0_10_;
  auVar128._10_2_ = auVar102._4_2_;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._0_8_ = auVar97._0_8_;
  auVar127._8_2_ = auVar97._4_2_;
  auVar36._4_8_ = auVar127._8_8_;
  auVar36._2_2_ = auVar102._2_2_;
  auVar36._0_2_ = auVar97._2_2_;
  auVar169._0_2_ = auVar97._0_2_;
  auVar169._2_2_ = auVar102._0_2_;
  auVar169._4_12_ = auVar36;
  iVar38 = movmskps((uint)uVar47,auVar57 | auVar153);
  iVar101 = auVar94._8_4_;
  uVar157 = auVar115._8_4_;
  uVar162 = auVar127._8_4_;
  uVar164 = auVar75._8_4_;
  auVar104._8_4_ = (int)uVar157 >> 0x1f;
  auVar104._12_4_ = (int)auVar116._12_4_ >> 0x1f;
  auVar81._8_4_ = (int)uVar162 >> 0x1f;
  auVar81._12_4_ = (int)auVar128._12_4_ >> 0x1f;
  auVar97._8_4_ = (int)uVar164 >> 0x1f;
  auVar97._12_4_ = (int)auVar76._12_4_ >> 0x1f;
  if (iVar38 == 0) {
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    iVar61 = 0;
    iVar71 = 0;
    iVar73 = 0;
    iVar74 = 0;
  }
  else {
    auVar148._0_4_ = iVar147 + CONCAT22(auVar141._0_2_,auVar68._0_2_);
    auVar148._4_4_ = iVar150 + auVar33._0_4_;
    auVar148._8_4_ = iVar151 + iVar101;
    auVar148._12_4_ = iVar152 + auVar95._12_4_;
    auVar104._0_4_ = (int)auVar167._0_2_ >> 0xf;
    auVar104._4_4_ = auVar34._0_4_ >> 0x1f;
    auVar168._0_8_ = CONCAT44(auVar104._0_4_,auVar104._0_4_);
    auVar168._8_4_ = auVar104._4_4_;
    auVar168._12_4_ = auVar104._4_4_;
    auVar173._0_8_ = CONCAT44(auVar104._8_4_,auVar104._8_4_);
    auVar173._8_4_ = auVar104._12_4_;
    auVar173._12_4_ = auVar104._12_4_;
    auVar78 = auVar78 ^ auVar104;
    auVar79._0_4_ = auVar78._0_4_ - auVar104._0_4_;
    auVar79._4_4_ = auVar78._4_4_ - auVar104._4_4_;
    auVar79._8_4_ = auVar78._8_4_ - auVar104._8_4_;
    auVar79._12_4_ = auVar78._12_4_ - auVar104._12_4_;
    auVar105._0_8_ = (ulong)auVar148._0_4_ * (ulong)auVar79._0_4_;
    auVar105._8_8_ = (auVar148._8_8_ & 0xffffffff) * (ulong)auVar79._8_4_;
    auVar80._0_8_ = (ulong)auVar79._4_4_ * (ulong)auVar148._4_4_;
    auVar80._8_8_ = (auVar79._8_8_ >> 0x20) * (auVar148._8_8_ >> 0x20);
    auVar106._0_4_ =
         (int)((ulong)(SUB168(auVar105 ^ auVar168,0) - auVar168._0_8_) >> 0x10) + auVar148._0_4_;
    auVar106._4_4_ =
         (int)((ulong)(SUB168(auVar80 ^ auVar173,0) - auVar173._0_8_) >> 0x10) + auVar148._4_4_;
    auVar106._8_4_ =
         (int)((ulong)(SUB168(auVar105 ^ auVar168,8) - auVar168._8_8_) >> 0x10) + auVar148._8_4_;
    auVar106._12_4_ =
         (int)((ulong)(SUB168(auVar80 ^ auVar173,8) - auVar173._8_8_) >> 0x10) + auVar148._12_4_;
    auVar81._0_4_ = (int)auVar102._0_2_ >> 0xf;
    auVar81._4_4_ = auVar36._0_4_ >> 0x1f;
    auVar149._0_8_ = CONCAT44(auVar81._0_4_,auVar81._0_4_);
    auVar149._8_4_ = auVar81._4_4_;
    auVar149._12_4_ = auVar81._4_4_;
    auVar158._0_8_ = CONCAT44(auVar81._8_4_,auVar81._8_4_);
    auVar158._8_4_ = auVar81._12_4_;
    auVar158._12_4_ = auVar81._12_4_;
    auVar169 = auVar169 ^ auVar81;
    auVar170._0_4_ = auVar169._0_4_ - auVar81._0_4_;
    auVar170._4_4_ = auVar169._4_4_ - auVar81._4_4_;
    auVar170._8_4_ = auVar169._8_4_ - auVar81._8_4_;
    auVar170._12_4_ = auVar169._12_4_ - auVar81._12_4_;
    auVar82._0_8_ = (ulong)auVar106._0_4_ * (ulong)auVar170._0_4_;
    auVar82._8_8_ = (auVar106._8_8_ & 0xffffffff) * (ulong)auVar170._8_4_;
    auVar171._0_8_ = (ulong)auVar170._4_4_ * (ulong)auVar106._4_4_;
    auVar171._8_8_ = (auVar170._8_8_ >> 0x20) * (auVar106._8_8_ >> 0x20);
    auVar68._0_4_ = iVar61 + iVar101;
    auVar68._4_4_ = iVar71 + auVar95._12_4_;
    auVar68._8_4_ = iVar73 + iVar101;
    auVar68._12_4_ = iVar74 + auVar95._12_4_;
    auVar107._0_8_ = CONCAT44(auVar104._8_4_,auVar104._8_4_);
    auVar107._8_4_ = auVar104._12_4_;
    auVar107._12_4_ = auVar104._12_4_;
    auVar118._0_8_ = CONCAT44(auVar104._8_4_,auVar104._8_4_);
    auVar118._8_4_ = auVar104._12_4_;
    auVar118._12_4_ = auVar104._12_4_;
    auVar130._0_4_ = (uVar157 ^ auVar104._8_4_) - auVar104._8_4_;
    auVar130._4_4_ = (auVar116._12_4_ ^ auVar104._12_4_) - auVar104._12_4_;
    auVar130._8_4_ = (uVar157 ^ auVar104._8_4_) - auVar104._8_4_;
    auVar130._12_4_ = (auVar116._12_4_ ^ auVar104._12_4_) - auVar104._12_4_;
    auVar83._0_8_ = (ulong)auVar68._0_4_ * (ulong)auVar130._0_4_;
    auVar83._8_8_ = (auVar68._8_8_ & 0xffffffff) * (ulong)auVar130._8_4_;
    auVar131._0_8_ = (ulong)auVar130._4_4_ * (ulong)auVar68._4_4_;
    auVar131._8_8_ = (auVar130._8_8_ >> 0x20) * (auVar68._8_8_ >> 0x20);
    auVar84._0_4_ =
         (int)((ulong)(SUB168(auVar83 ^ auVar107,0) - auVar107._0_8_) >> 0x10) + auVar68._0_4_;
    auVar84._4_4_ =
         (int)((ulong)(SUB168(auVar131 ^ auVar118,0) - auVar118._0_8_) >> 0x10) + auVar68._4_4_;
    auVar84._8_4_ =
         (int)((ulong)(SUB168(auVar83 ^ auVar107,8) - auVar107._8_8_) >> 0x10) + auVar68._8_4_;
    auVar84._12_4_ =
         (int)((ulong)(SUB168(auVar131 ^ auVar118,8) - auVar118._8_8_) >> 0x10) + auVar68._12_4_;
    auVar108._0_8_ = CONCAT44(auVar81._8_4_,auVar81._8_4_);
    auVar108._8_4_ = auVar81._12_4_;
    auVar108._12_4_ = auVar81._12_4_;
    auVar119._0_8_ = CONCAT44(auVar81._8_4_,auVar81._8_4_);
    auVar119._8_4_ = auVar81._12_4_;
    auVar119._12_4_ = auVar81._12_4_;
    auVar132._0_4_ = (uVar162 ^ auVar81._8_4_) - auVar81._8_4_;
    auVar132._4_4_ = (auVar128._12_4_ ^ auVar81._12_4_) - auVar81._12_4_;
    auVar132._8_4_ = (uVar162 ^ auVar81._8_4_) - auVar81._8_4_;
    auVar132._12_4_ = (auVar128._12_4_ ^ auVar81._12_4_) - auVar81._12_4_;
    auVar62._0_8_ = (ulong)auVar84._0_4_ * (ulong)auVar132._0_4_;
    auVar62._8_8_ = (auVar84._8_8_ & 0xffffffff) * (ulong)auVar132._8_4_;
    auVar133._0_8_ = (ulong)auVar132._4_4_ * (ulong)auVar84._4_4_;
    auVar133._8_8_ = (auVar132._8_8_ >> 0x20) * (auVar84._8_8_ >> 0x20);
    auVar159._0_4_ =
         ((uint)((ulong)(SUB168(auVar82 ^ auVar149,0) - auVar149._0_8_) >> 0x10) ^ uVar45) - uVar45;
    auVar159._4_4_ =
         ((uint)((ulong)(SUB168(auVar171 ^ auVar158,0) - auVar158._0_8_) >> 0x10) ^ uVar49) - uVar49
    ;
    auVar159._8_4_ =
         ((uint)((ulong)(SUB168(auVar82 ^ auVar149,8) - auVar149._8_8_) >> 0x10) ^ uVar52) - uVar52;
    auVar159._12_4_ =
         ((uint)((ulong)(SUB168(auVar171 ^ auVar158,8) - auVar158._8_8_) >> 0x10) ^ uVar55) - uVar55
    ;
    auVar63._0_4_ =
         ((uint)((ulong)(SUB168(auVar62 ^ auVar108,0) - auVar108._0_8_) >> 0x10) ^ uVar156) -
         uVar156;
    auVar63._4_4_ =
         ((uint)((ulong)(SUB168(auVar133 ^ auVar119,0) - auVar119._0_8_) >> 0x10) ^ uVar161) -
         uVar161;
    auVar63._8_4_ =
         ((uint)((ulong)(SUB168(auVar62 ^ auVar108,8) - auVar108._8_8_) >> 0x10) ^ uVar163) -
         uVar163;
    auVar63._12_4_ =
         ((uint)((ulong)(SUB168(auVar133 ^ auVar119,8) - auVar119._8_8_) >> 0x10) ^ uVar165) -
         uVar165;
    auVar153 = auVar153 & auVar159;
    auVar57 = auVar57 & auVar63;
    *(undefined1 (*) [16])qcoeff_ptr = auVar153;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = auVar57;
    auVar85._0_4_ = auVar153._0_4_ >> 0x1f;
    auVar85._4_4_ = auVar153._4_4_ >> 0x1f;
    auVar85._8_4_ = auVar153._8_4_ >> 0x1f;
    auVar85._12_4_ = auVar153._12_4_ >> 0x1f;
    auVar153 = auVar153 ^ auVar85;
    auVar154._0_4_ = auVar153._0_4_ - auVar85._0_4_;
    auVar154._4_4_ = auVar153._4_4_ - auVar85._4_4_;
    auVar154._8_4_ = auVar153._8_4_ - auVar85._8_4_;
    auVar154._12_4_ = auVar153._12_4_ - auVar85._12_4_;
    auVar97._0_4_ = (int)auVar172._0_2_ >> 0xf;
    auVar97._4_4_ = auVar35._0_4_ >> 0x1f;
    auVar109._0_8_ = CONCAT44(auVar97._0_4_,auVar97._0_4_);
    auVar109._8_4_ = auVar97._4_4_;
    auVar109._12_4_ = auVar97._4_4_;
    auVar120._0_8_ = CONCAT44(auVar97._8_4_,auVar97._8_4_);
    auVar120._8_4_ = auVar97._12_4_;
    auVar120._12_4_ = auVar97._12_4_;
    auVar64 = auVar64 ^ auVar97;
    auVar65._0_4_ = auVar64._0_4_ - auVar97._0_4_;
    auVar65._4_4_ = auVar64._4_4_ - auVar97._4_4_;
    auVar65._8_4_ = auVar64._8_4_ - auVar97._8_4_;
    auVar65._12_4_ = auVar64._12_4_ - auVar97._12_4_;
    auVar134._0_8_ = (ulong)auVar154._0_4_ * (ulong)auVar65._0_4_;
    auVar134._8_8_ = (auVar154._8_8_ & 0xffffffff) * (ulong)auVar65._8_4_;
    auVar66._0_8_ = (ulong)auVar65._4_4_ * (ulong)auVar154._4_4_;
    auVar66._8_8_ = (auVar65._8_8_ >> 0x20) * (auVar154._8_8_ >> 0x20);
    auVar135._0_8_ = SUB168(auVar134 ^ auVar109,0) - auVar109._0_8_;
    auVar135._8_8_ = SUB168(auVar134 ^ auVar109,8) - auVar109._8_8_;
    auVar67._0_8_ = SUB168(auVar66 ^ auVar120,0) - auVar120._0_8_ << 0x20;
    auVar67._8_8_ = SUB168(auVar66 ^ auVar120,8) - auVar120._8_8_ << 0x20;
    auVar68 = (auVar67 | auVar135 & _DAT_00514a40) ^ auVar85;
    auVar155._0_4_ = auVar57._0_4_ >> 0x1f;
    auVar155._4_4_ = auVar57._4_4_ >> 0x1f;
    auVar155._8_4_ = auVar57._8_4_ >> 0x1f;
    auVar155._12_4_ = auVar57._12_4_ >> 0x1f;
    auVar57 = auVar57 ^ auVar155;
    auVar145._0_4_ = auVar57._0_4_ - auVar155._0_4_;
    auVar145._4_4_ = auVar57._4_4_ - auVar155._4_4_;
    auVar145._8_4_ = auVar57._8_4_ - auVar155._8_4_;
    auVar145._12_4_ = auVar57._12_4_ - auVar155._12_4_;
    auVar121._0_8_ = CONCAT44(auVar97._8_4_,auVar97._8_4_);
    auVar121._8_4_ = auVar97._12_4_;
    auVar121._12_4_ = auVar97._12_4_;
    auVar136._0_8_ = CONCAT44(auVar97._8_4_,auVar97._8_4_);
    auVar136._8_4_ = auVar97._12_4_;
    auVar136._12_4_ = auVar97._12_4_;
    auVar86._0_4_ = (uVar164 ^ auVar97._8_4_) - auVar97._8_4_;
    auVar86._4_4_ = (auVar76._12_4_ ^ auVar97._12_4_) - auVar97._12_4_;
    auVar86._8_4_ = (uVar164 ^ auVar97._8_4_) - auVar97._8_4_;
    auVar86._12_4_ = (auVar76._12_4_ ^ auVar97._12_4_) - auVar97._12_4_;
    auVar110._0_8_ = (ulong)auVar145._0_4_ * (ulong)auVar86._0_4_;
    auVar110._8_8_ = (auVar145._8_8_ & 0xffffffff) * (ulong)auVar86._8_4_;
    auVar87._0_8_ = (ulong)auVar86._4_4_ * (ulong)auVar145._4_4_;
    auVar87._8_8_ = (auVar86._8_8_ >> 0x20) * (auVar145._8_8_ >> 0x20);
    auVar111._0_8_ = SUB168(auVar110 ^ auVar121,0) - auVar121._0_8_;
    auVar111._8_8_ = SUB168(auVar110 ^ auVar121,8) - auVar121._8_8_;
    auVar88._0_8_ = SUB168(auVar87 ^ auVar136,0) - auVar136._0_8_ << 0x20;
    auVar88._8_8_ = SUB168(auVar87 ^ auVar136,8) - auVar136._8_8_ << 0x20;
    auVar64 = (auVar88 | auVar111 & _DAT_00514a40) ^ auVar155;
    iVar61 = auVar64._0_4_ - auVar155._0_4_;
    iVar71 = auVar64._4_4_ - auVar155._4_4_;
    iVar73 = auVar64._8_4_ - auVar155._8_4_;
    iVar74 = auVar64._12_4_ - auVar155._12_4_;
    *dqcoeff_ptr = auVar68._0_4_ - auVar85._0_4_;
    dqcoeff_ptr[1] = auVar68._4_4_ - auVar85._4_4_;
    dqcoeff_ptr[2] = auVar68._8_4_ - auVar85._8_4_;
    dqcoeff_ptr[3] = auVar68._12_4_ - auVar85._12_4_;
  }
  local_168._2_2_ = (ushort)(-1 < (short)local_168._2_2_) * local_168._2_2_;
  local_168._0_2_ = (ushort)(-1 < (short)local_168._0_2_) * local_168._0_2_;
  local_168._4_2_ = (ushort)(-1 < (short)local_168._4_2_) * local_168._4_2_;
  local_168._6_2_ = (ushort)(-1 < (short)local_168._6_2_) * local_168._6_2_;
  local_168._8_2_ = (ushort)(-1 < (short)local_168._8_2_) * local_168._8_2_;
  local_168._10_2_ = (ushort)(-1 < (short)local_168._10_2_) * local_168._10_2_;
  local_168._12_2_ = (ushort)(-1 < (short)local_168._12_2_) * local_168._12_2_;
  local_168._14_2_ = (ushort)(-1 < (short)local_168._14_2_) * local_168._14_2_;
  uVar44 = (ushort)(-1 < auVar46._0_2_) * auVar46._0_2_;
  uVar47 = (ushort)(-1 < auVar46._2_2_) * auVar46._2_2_;
  uVar48 = (ushort)(-1 < auVar46._4_2_) * auVar46._4_2_;
  uVar50 = (ushort)(-1 < auVar46._6_2_) * auVar46._6_2_;
  uVar51 = (ushort)(-1 < auVar46._8_2_) * auVar46._8_2_;
  uVar53 = (ushort)(-1 < auVar46._10_2_) * auVar46._10_2_;
  uVar54 = (ushort)(-1 < auVar46._12_2_) * auVar46._12_2_;
  uVar56 = (ushort)(-1 < auVar46._14_2_) * auVar46._14_2_;
  dqcoeff_ptr[4] = iVar61;
  dqcoeff_ptr[5] = iVar71;
  dqcoeff_ptr[6] = iVar73;
  dqcoeff_ptr[7] = iVar74;
  if (8 < n_coeffs) {
    uVar156 = (uVar157 ^ auVar104._8_4_) - auVar104._8_4_;
    uVar161 = (auVar116._12_4_ ^ auVar104._12_4_) - auVar104._12_4_;
    uVar163 = (uVar157 ^ auVar104._8_4_) - auVar104._8_4_;
    uVar165 = (auVar116._12_4_ ^ auVar104._12_4_) - auVar104._12_4_;
    uVar45 = (uVar162 ^ auVar81._8_4_) - auVar81._8_4_;
    uVar49 = (auVar128._12_4_ ^ auVar81._12_4_) - auVar81._12_4_;
    uVar52 = (uVar162 ^ auVar81._8_4_) - auVar81._8_4_;
    uVar55 = (auVar128._12_4_ ^ auVar81._12_4_) - auVar81._12_4_;
    uVar157 = (uVar164 ^ auVar97._8_4_) - auVar97._8_4_;
    uVar162 = (auVar76._12_4_ ^ auVar97._12_4_) - auVar97._12_4_;
    uVar164 = (uVar164 ^ auVar97._8_4_) - auVar97._8_4_;
    uVar166 = (auVar76._12_4_ ^ auVar97._12_4_) - auVar97._12_4_;
    lVar43 = 8;
    uVar40 = CONCAT44(auVar104._8_4_,auVar104._8_4_);
    uVar31 = CONCAT44(auVar104._12_4_,auVar104._12_4_);
    do {
      puVar1 = (uint *)(coeff_ptr + lVar43);
      puVar2 = (uint *)(coeff_ptr + lVar43 + 4);
      uVar140 = (int)*puVar1 >> 0x1f;
      uVar142 = (int)puVar1[1] >> 0x1f;
      uVar143 = (int)puVar1[2] >> 0x1f;
      uVar144 = (int)puVar1[3] >> 0x1f;
      uVar126 = (int)*puVar2 >> 0x1f;
      uVar137 = (int)puVar2[1] >> 0x1f;
      uVar138 = (int)puVar2[2] >> 0x1f;
      uVar139 = (int)puVar2[3] >> 0x1f;
      iVar61 = (*puVar1 ^ uVar140) - uVar140;
      iVar71 = (puVar1[1] ^ uVar142) - uVar142;
      iVar73 = (puVar1[2] ^ uVar143) - uVar143;
      iVar74 = (puVar1[3] ^ uVar144) - uVar144;
      iVar147 = (*puVar2 ^ uVar126) - uVar126;
      iVar150 = (puVar2[1] ^ uVar137) - uVar137;
      iVar151 = (puVar2[2] ^ uVar138) - uVar138;
      iVar152 = (puVar2[3] ^ uVar139) - uVar139;
      auVar46._0_4_ = -(uint)(aiStack_154[0] < iVar61 * 0x20);
      auVar46._4_4_ = -(uint)(aiStack_154[0] < iVar71 * 0x20);
      auVar46._8_4_ = -(uint)(aiStack_154[0] < iVar73 * 0x20);
      auVar46._12_4_ = -(uint)(aiStack_154[0] < iVar74 * 0x20);
      auVar89._0_4_ = -(uint)(aiStack_154[0] < iVar147 * 0x20);
      auVar89._4_4_ = -(uint)(aiStack_154[0] < iVar150 * 0x20);
      auVar89._8_4_ = -(uint)(aiStack_154[0] < iVar151 * 0x20);
      auVar89._12_4_ = -(uint)(aiStack_154[0] < iVar152 * 0x20);
      auVar46 = packssdw(auVar46,auVar89);
      auVar68 = (undefined1  [16])0x0;
      if ((((((((((((((((auVar46 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar46 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar46 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar46 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar46 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar46 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar46 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar46 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar46 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar46 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar46 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar46 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar46 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar46 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar46 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar46[0xf] < '\0'
         ) {
        auVar68 = auVar46 & *(undefined1 (*) [16])(iscan + lVar43);
        bVar37 = true;
      }
      auVar112._0_4_ = -(uint)(iVar58 < iVar61);
      auVar112._4_4_ = -(uint)(iVar59 < iVar71);
      auVar112._8_4_ = -(uint)(iVar58 < iVar73);
      auVar112._12_4_ = -(uint)(iVar59 < iVar74);
      auVar98._0_4_ = -(uint)(iVar58 < iVar147);
      auVar98._4_4_ = -(uint)(iVar59 < iVar150);
      auVar98._8_4_ = -(uint)(iVar58 < iVar151);
      auVar98._12_4_ = -(uint)(iVar59 < iVar152);
      auVar46 = packssdw(auVar112,auVar98);
      uVar60 = (ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar46[0xf] >> 7) << 0xf;
      if (uVar60 == 0) {
        auVar46 = (undefined1  [16])0x0;
      }
      else {
        auVar46 = auVar46 & *(undefined1 (*) [16])(iscan + lVar43);
        bVar42 = true;
      }
      iVar38 = movmskps((uint)uVar60,auVar98 | auVar112);
      if (iVar38 == 0) {
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar43 + 4) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(dqcoeff_ptr + lVar43) = (undefined1  [16])0x0;
      }
      else {
        auVar122._0_4_ = iVar61 + iVar101;
        auVar122._4_4_ = iVar71 + auVar95._12_4_;
        auVar122._8_4_ = iVar73 + iVar101;
        auVar122._12_4_ = iVar74 + auVar95._12_4_;
        uVar29 = CONCAT44(auVar104._8_4_,auVar104._8_4_);
        uVar30 = CONCAT44(auVar104._12_4_,auVar104._12_4_);
        auVar90._0_4_ =
             (int)(((ulong)auVar122._0_4_ * (ulong)uVar156 ^ uVar40) - uVar40 >> 0x10) +
             auVar122._0_4_;
        auVar90._4_4_ =
             (int)(((ulong)auVar122._4_4_ * (ulong)uVar161 ^ uVar29) - uVar29 >> 0x10) +
             auVar122._4_4_;
        auVar90._8_4_ =
             (int)(((auVar122._8_8_ & 0xffffffff) * (ulong)uVar163 ^ uVar31) - uVar31 >> 0x10) +
             auVar122._8_4_;
        auVar90._12_4_ =
             (int)(((auVar122._8_8_ >> 0x20) * (ulong)uVar165 ^ uVar30) - uVar30 >> 0x10) +
             auVar122._12_4_;
        uVar27 = CONCAT44(auVar81._8_4_,auVar81._8_4_);
        uVar28 = CONCAT44(auVar81._12_4_,auVar81._12_4_);
        uVar25 = CONCAT44(auVar81._8_4_,auVar81._8_4_);
        uVar26 = CONCAT44(auVar81._12_4_,auVar81._12_4_);
        auVar160._0_4_ = iVar147 + iVar101;
        auVar160._4_4_ = iVar150 + auVar95._12_4_;
        auVar160._8_4_ = iVar151 + iVar101;
        auVar160._12_4_ = iVar152 + auVar95._12_4_;
        auVar91._0_4_ =
             (int)(((ulong)auVar160._0_4_ * (ulong)uVar156 ^ uVar40) - uVar40 >> 0x10) +
             auVar160._0_4_;
        auVar91._4_4_ =
             (int)(((ulong)auVar160._4_4_ * (ulong)uVar161 ^ uVar29) - uVar29 >> 0x10) +
             auVar160._4_4_;
        auVar91._8_4_ =
             (int)(((auVar160._8_8_ & 0xffffffff) * (ulong)uVar163 ^ uVar31) - uVar31 >> 0x10) +
             auVar160._8_4_;
        auVar91._12_4_ =
             (int)(((auVar160._8_8_ >> 0x20) * (ulong)uVar165 ^ uVar30) - uVar30 >> 0x10) +
             auVar160._12_4_;
        auVar146._0_4_ =
             ((uint)(((ulong)auVar90._0_4_ * (ulong)uVar45 ^ uVar27) - uVar27 >> 0x10) ^ uVar140) -
             uVar140;
        auVar146._4_4_ =
             ((uint)(((ulong)auVar90._4_4_ * (ulong)uVar49 ^ uVar25) - uVar25 >> 0x10) ^ uVar142) -
             uVar142;
        auVar146._8_4_ =
             ((uint)(((auVar90._8_8_ & 0xffffffff) * (ulong)uVar52 ^ uVar28) - uVar28 >> 0x10) ^
             uVar143) - uVar143;
        auVar146._12_4_ =
             ((uint)(((auVar90._8_8_ >> 0x20) * (ulong)uVar55 ^ uVar26) - uVar26 >> 0x10) ^ uVar144)
             - uVar144;
        auVar123._0_4_ =
             ((uint)(((ulong)auVar91._0_4_ * (ulong)uVar45 ^ uVar27) - uVar27 >> 0x10) ^ uVar126) -
             uVar126;
        auVar123._4_4_ =
             ((uint)(((ulong)auVar91._4_4_ * (ulong)uVar49 ^ uVar25) - uVar25 >> 0x10) ^ uVar137) -
             uVar137;
        auVar123._8_4_ =
             ((uint)(((auVar91._8_8_ & 0xffffffff) * (ulong)uVar52 ^ uVar28) - uVar28 >> 0x10) ^
             uVar138) - uVar138;
        auVar123._12_4_ =
             ((uint)(((auVar91._8_8_ >> 0x20) * (ulong)uVar55 ^ uVar26) - uVar26 >> 0x10) ^ uVar139)
             - uVar139;
        auVar112 = auVar112 & auVar146;
        auVar98 = auVar98 & auVar123;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43) = auVar112;
        *(undefined1 (*) [16])(qcoeff_ptr + lVar43 + 4) = auVar98;
        auVar92._0_4_ = auVar112._0_4_ >> 0x1f;
        auVar92._4_4_ = auVar112._4_4_ >> 0x1f;
        auVar92._8_4_ = auVar112._8_4_ >> 0x1f;
        auVar92._12_4_ = auVar112._12_4_ >> 0x1f;
        auVar112 = auVar112 ^ auVar92;
        auVar113._0_4_ = auVar112._0_4_ - auVar92._0_4_;
        auVar113._4_4_ = auVar112._4_4_ - auVar92._4_4_;
        auVar113._8_4_ = auVar112._8_4_ - auVar92._8_4_;
        auVar113._12_4_ = auVar112._12_4_ - auVar92._12_4_;
        uVar27 = CONCAT44(auVar97._8_4_,auVar97._8_4_);
        uVar28 = CONCAT44(auVar97._12_4_,auVar97._12_4_);
        auVar124._0_8_ = ((ulong)auVar113._0_4_ * (ulong)uVar157 ^ uVar27) - uVar27;
        auVar124._8_8_ = ((auVar113._8_8_ & 0xffffffff) * (ulong)uVar164 ^ uVar28) - uVar28;
        uVar25 = (ulong)auVar97._8_4_;
        uVar26 = (ulong)auVar97._12_4_;
        auVar114._0_8_ = ((ulong)auVar113._4_4_ * (ulong)uVar162 ^ uVar25) - uVar25 << 0x20;
        auVar114._8_8_ = ((auVar113._8_8_ >> 0x20) * (ulong)uVar166 ^ uVar26) - uVar26 << 0x20;
        auVar102 = (auVar114 | auVar124 & _DAT_00514a40) ^ auVar92;
        auVar93._0_4_ = auVar98._0_4_ >> 0x1f;
        auVar93._4_4_ = auVar98._4_4_ >> 0x1f;
        auVar93._8_4_ = auVar98._8_4_ >> 0x1f;
        auVar93._12_4_ = auVar98._12_4_ >> 0x1f;
        auVar98 = auVar98 ^ auVar93;
        auVar99._0_4_ = auVar98._0_4_ - auVar93._0_4_;
        auVar99._4_4_ = auVar98._4_4_ - auVar93._4_4_;
        auVar99._8_4_ = auVar98._8_4_ - auVar93._8_4_;
        auVar99._12_4_ = auVar98._12_4_ - auVar93._12_4_;
        auVar125._0_8_ = ((ulong)auVar99._0_4_ * (ulong)uVar157 ^ uVar27) - uVar27;
        auVar125._8_8_ = ((auVar99._8_8_ & 0xffffffff) * (ulong)uVar164 ^ uVar28) - uVar28;
        auVar100._0_8_ = ((ulong)auVar99._4_4_ * (ulong)uVar162 ^ uVar25) - uVar25 << 0x20;
        auVar100._8_8_ = ((auVar99._8_8_ >> 0x20) * (ulong)uVar166 ^ uVar26) - uVar26 << 0x20;
        auVar64 = (auVar100 | auVar125 & _DAT_00514a40) ^ auVar93;
        piVar41 = dqcoeff_ptr + lVar43;
        *piVar41 = auVar102._0_4_ - auVar92._0_4_;
        piVar41[1] = auVar102._4_4_ - auVar92._4_4_;
        piVar41[2] = auVar102._8_4_ - auVar92._8_4_;
        piVar41[3] = auVar102._12_4_ - auVar92._12_4_;
        piVar41 = dqcoeff_ptr + lVar43 + 4;
        *piVar41 = auVar64._0_4_ - auVar93._0_4_;
        piVar41[1] = auVar64._4_4_ - auVar93._4_4_;
        piVar41[2] = auVar64._8_4_ - auVar93._8_4_;
        piVar41[3] = auVar64._12_4_ - auVar93._12_4_;
      }
      sVar3 = auVar68._0_2_;
      sVar4 = auVar68._2_2_;
      sVar5 = auVar68._4_2_;
      sVar6 = auVar68._6_2_;
      sVar7 = auVar68._8_2_;
      sVar8 = auVar68._10_2_;
      sVar9 = auVar68._12_2_;
      sVar10 = auVar68._14_2_;
      local_168._2_2_ =
           (ushort)((short)local_168._2_2_ < sVar4) * sVar4 |
           (ushort)((short)local_168._2_2_ >= sVar4) * local_168._2_2_;
      local_168._0_2_ =
           (ushort)((short)local_168._0_2_ < sVar3) * sVar3 |
           (ushort)((short)local_168._0_2_ >= sVar3) * local_168._0_2_;
      local_168._4_2_ =
           (ushort)((short)local_168._4_2_ < sVar5) * sVar5 |
           (ushort)((short)local_168._4_2_ >= sVar5) * local_168._4_2_;
      local_168._6_2_ =
           (ushort)((short)local_168._6_2_ < sVar6) * sVar6 |
           (ushort)((short)local_168._6_2_ >= sVar6) * local_168._6_2_;
      local_168._8_2_ =
           (ushort)((short)local_168._8_2_ < sVar7) * sVar7 |
           (ushort)((short)local_168._8_2_ >= sVar7) * local_168._8_2_;
      local_168._10_2_ =
           (ushort)((short)local_168._10_2_ < sVar8) * sVar8 |
           (ushort)((short)local_168._10_2_ >= sVar8) * local_168._10_2_;
      local_168._12_2_ =
           (ushort)((short)local_168._12_2_ < sVar9) * sVar9 |
           (ushort)((short)local_168._12_2_ >= sVar9) * local_168._12_2_;
      local_168._14_2_ =
           (ushort)((short)local_168._14_2_ < sVar10) * sVar10 |
           (ushort)((short)local_168._14_2_ >= sVar10) * local_168._14_2_;
      sVar3 = auVar46._0_2_;
      uVar44 = (ushort)((short)uVar44 < sVar3) * sVar3 | ((short)uVar44 >= sVar3) * uVar44;
      sVar3 = auVar46._2_2_;
      uVar47 = (ushort)((short)uVar47 < sVar3) * sVar3 | ((short)uVar47 >= sVar3) * uVar47;
      sVar3 = auVar46._4_2_;
      uVar48 = (ushort)((short)uVar48 < sVar3) * sVar3 | ((short)uVar48 >= sVar3) * uVar48;
      sVar3 = auVar46._6_2_;
      uVar50 = (ushort)((short)uVar50 < sVar3) * sVar3 | ((short)uVar50 >= sVar3) * uVar50;
      sVar3 = auVar46._8_2_;
      uVar51 = (ushort)((short)uVar51 < sVar3) * sVar3 | ((short)uVar51 >= sVar3) * uVar51;
      sVar3 = auVar46._10_2_;
      uVar53 = (ushort)((short)uVar53 < sVar3) * sVar3 | ((short)uVar53 >= sVar3) * uVar53;
      sVar3 = auVar46._12_2_;
      uVar54 = (ushort)((short)uVar54 < sVar3) * sVar3 | ((short)uVar54 >= sVar3) * uVar54;
      sVar3 = auVar46._14_2_;
      uVar56 = (ushort)((short)uVar56 < sVar3) * sVar3 | ((short)uVar56 >= sVar3) * uVar56;
      lVar43 = lVar43 + 8;
    } while (lVar43 < n_coeffs);
  }
  if (bVar37) {
    uVar60 = (ushort)((short)local_168._8_2_ < (short)local_168._0_2_) * local_168._0_2_ |
             (ushort)((short)local_168._8_2_ >= (short)local_168._0_2_) * local_168._8_2_;
    uVar69 = (ushort)((short)local_168._10_2_ < (short)local_168._2_2_) * local_168._2_2_ |
             (ushort)((short)local_168._10_2_ >= (short)local_168._2_2_) * local_168._10_2_;
    uVar70 = (ushort)((short)local_168._12_2_ < (short)local_168._4_2_) * local_168._4_2_ |
             (ushort)((short)local_168._12_2_ >= (short)local_168._4_2_) * local_168._12_2_;
    uVar72 = (ushort)((short)local_168._14_2_ < (short)local_168._6_2_) * local_168._6_2_ |
             (ushort)((short)local_168._14_2_ >= (short)local_168._6_2_) * local_168._14_2_;
    uVar60 = ((short)uVar70 < (short)uVar60) * uVar60 | ((short)uVar70 >= (short)uVar60) * uVar70;
    uVar69 = ((short)uVar72 < (short)uVar69) * uVar69 | ((short)uVar72 >= (short)uVar69) * uVar72;
    uVar45 = (ushort)(((short)uVar69 < (short)uVar60) * uVar60 |
                     ((short)uVar69 >= (short)uVar60) * uVar69) + 1;
  }
  else {
    uVar45 = 0;
  }
  if (bVar42) {
    uVar51 = ((short)uVar51 < (short)uVar44) * uVar44 | ((short)uVar51 >= (short)uVar44) * uVar51;
    uVar53 = ((short)uVar53 < (short)uVar47) * uVar47 | ((short)uVar53 >= (short)uVar47) * uVar53;
    uVar47 = ((short)uVar54 < (short)uVar48) * uVar48 | ((short)uVar54 >= (short)uVar48) * uVar54;
    uVar48 = ((short)uVar56 < (short)uVar50) * uVar50 | ((short)uVar56 >= (short)uVar50) * uVar56;
    uVar47 = ((short)uVar47 < (short)uVar51) * uVar51 | ((short)uVar47 >= (short)uVar51) * uVar47;
    uVar48 = ((short)uVar48 < (short)uVar53) * uVar53 | ((short)uVar48 >= (short)uVar53) * uVar48;
    uVar49 = (uint)(ushort)(((short)uVar48 < (short)uVar47) * uVar47 |
                           ((short)uVar48 >= (short)uVar47) * uVar48);
  }
  else {
    uVar49 = 0xffffffff;
  }
  if ((int)uVar45 <= (int)uVar49) {
    iVar58 = uVar49 + 1;
    psVar39 = scan + uVar49;
    do {
      sVar3 = *psVar39;
      qcoeff_ptr[sVar3] = 0;
      dqcoeff_ptr[sVar3] = 0;
      iVar58 = iVar58 + -1;
      psVar39 = psVar39 + -1;
    } while ((int)uVar45 < iVar58);
  }
  iVar58 = uVar45 + 1;
  uVar40 = (ulong)uVar45;
  do {
    if ((long)uVar40 < 1) {
      uVar47 = 0;
      break;
    }
    lVar43 = uVar40 - 1;
    uVar40 = uVar40 - 1;
    iVar58 = iVar58 + -1;
    uVar47 = (ushort)iVar58;
  } while (qcoeff_ptr[scan[lVar43]] == 0);
  *eob_ptr = uVar47;
  uVar49 = 0xffffffff;
  if (uVar45 != 0) {
    uVar40 = 0;
    do {
      if (qcoeff_ptr[scan[uVar40]] != 0) {
        uVar49 = (uint)uVar40;
        break;
      }
      uVar40 = uVar40 + 1;
    } while (uVar45 != uVar40);
  }
  if ((uVar47 != 0) && (uVar49 == uVar47 - 1)) {
    sVar3 = scan[uVar49];
    if (((qcoeff_ptr[sVar3] == 1) || (qcoeff_ptr[sVar3] == -1)) &&
       (uVar45 = coeff_ptr[sVar3] >> 0x1f, uVar40 = (ulong)((uint)(sVar3 != 0) * 2),
       (int)((coeff_ptr[sVar3] << 5 ^ uVar45) - uVar45) <
       *(short *)((long)zbin_ptr + uVar40) * 0x20 +
       (*(short *)((long)dequant_ptr + uVar40) * 0x20d + 0x40 >> 7))) {
      qcoeff_ptr[sVar3] = 0;
      dqcoeff_ptr[sVar3] = 0;
      *eob_ptr = 0;
    }
  }
  return;
}

Assistant:

void aom_highbd_quantize_b_adaptive_sse2(
    const tran_low_t *coeff_ptr, intptr_t n_coeffs, const int16_t *zbin_ptr,
    const int16_t *round_ptr, const int16_t *quant_ptr,
    const int16_t *quant_shift_ptr, tran_low_t *qcoeff_ptr,
    tran_low_t *dqcoeff_ptr, const int16_t *dequant_ptr, uint16_t *eob_ptr,
    const int16_t *scan, const int16_t *iscan) {
  int index = 8;
  const int log_scale = 0;
  int non_zero_count = 0;
  int non_zero_count_prescan_add_zero = 0;
  int is_found0 = 0, is_found1 = 0;
  int eob = -1;
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi32(1);
  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, coeff0_sign, coeff1_sign;
  __m128i qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, cmp_mask;
  __m128i all_zero;
  __m128i mask0 = zero, mask1 = zero;

  int prescan_add[2];
  int thresh[4];
  const qm_val_t wt = (1 << AOM_QM_BITS);
  for (int i = 0; i < 2; ++i) {
    prescan_add[i] = ROUND_POWER_OF_TWO(dequant_ptr[i] * EOB_FACTOR, 7);
    thresh[i] = (zbin_ptr[i] * wt + prescan_add[i]) - 1;
  }
  thresh[2] = thresh[3] = thresh[1];
  __m128i threshold[2];
  threshold[0] = _mm_loadu_si128((__m128i *)&thresh[0]);
  threshold[1] = _mm_unpackhi_epi64(threshold[0], threshold[0]);

#if SKIP_EOB_FACTOR_ADJUST
  int first = -1;
#endif
  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  __m128i zbin_sign = _mm_srai_epi16(zbin, 15);
  __m128i round_sign = _mm_srai_epi16(round, 15);
  __m128i quant_sign = _mm_srai_epi16(quant, 15);
  __m128i dequant_sign = _mm_srai_epi16(dequant, 15);
  __m128i shift_sign = _mm_srai_epi16(shift, 15);

  zbin = _mm_unpacklo_epi16(zbin, zbin_sign);
  round = _mm_unpacklo_epi16(round, round_sign);
  quant = _mm_unpacklo_epi16(quant, quant_sign);
  dequant = _mm_unpacklo_epi16(dequant, dequant_sign);
  shift = _mm_unpacklo_epi16(shift, shift_sign);
  zbin = _mm_sub_epi32(zbin, one);

  // Do DC and first 15 AC.
  coeff0 = _mm_load_si128((__m128i *)(coeff_ptr));
  coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + 4));

  coeff0_sign = _mm_srai_epi32(coeff0, 31);
  coeff1_sign = _mm_srai_epi32(coeff1, 31);
  qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
  qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

  highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan, &is_found0, &mask0);

  cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);  // Switch DC to AC
  cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
  cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
  highbd_update_mask1(&cmp_mask, iscan, &is_found1, &mask1);

  threshold[0] = threshold[1];
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);

    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    // Reinsert signs
    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    // Mask out zbin threshold coeffs
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), coeff1);
  }

  // AC only loop.
  while (index < n_coeffs) {
    coeff0 = _mm_load_si128((__m128i *)(coeff_ptr + index));
    coeff1 = _mm_load_si128((__m128i *)(coeff_ptr + index + 4));

    coeff0_sign = _mm_srai_epi32(coeff0, 31);
    coeff1_sign = _mm_srai_epi32(coeff1, 31);
    qcoeff0 = invert_sign_32_sse2(coeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(coeff1, coeff1_sign);

    highbd_update_mask0(&qcoeff0, &qcoeff1, threshold, iscan + index,
                        &is_found0, &mask0);

    cmp_mask0 = _mm_cmpgt_epi32(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi32(qcoeff1, zbin);
    cmp_mask = _mm_packs_epi32(cmp_mask0, cmp_mask1);
    highbd_update_mask1(&cmp_mask, iscan + index, &is_found1, &mask1);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      index += 8;
      continue;
    }
    highbd_calculate_qcoeff(&qcoeff0, &round, &quant, &shift, &log_scale);
    highbd_calculate_qcoeff(&qcoeff1, &round, &quant, &shift, &log_scale);

    qcoeff0 = invert_sign_32_sse2(qcoeff0, coeff0_sign);
    qcoeff1 = invert_sign_32_sse2(qcoeff1, coeff1_sign);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    _mm_store_si128((__m128i *)(qcoeff_ptr + index), qcoeff0);
    _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), qcoeff1);

    coeff0 = highbd_calculate_dqcoeff(qcoeff0, dequant, log_scale);
    coeff1 = highbd_calculate_dqcoeff(qcoeff1, dequant, log_scale);

    _mm_store_si128((__m128i *)(dqcoeff_ptr + index), coeff0);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), coeff1);

    index += 8;
  }
  if (is_found0) non_zero_count = calculate_non_zero_count(mask0);
  if (is_found1)
    non_zero_count_prescan_add_zero = calculate_non_zero_count(mask1);

  for (int i = non_zero_count_prescan_add_zero - 1; i >= non_zero_count; i--) {
    const int rc = scan[i];
    qcoeff_ptr[rc] = 0;
    dqcoeff_ptr[rc] = 0;
  }

  for (int i = non_zero_count - 1; i >= 0; i--) {
    const int rc = scan[i];
    if (qcoeff_ptr[rc]) {
      eob = i;
      break;
    }
  }

  *eob_ptr = eob + 1;
#if SKIP_EOB_FACTOR_ADJUST
  // TODO(Aniket): Experiment the following loop with intrinsic by combining
  // with the quantization loop above
  for (int i = 0; i < non_zero_count; i++) {
    const int rc = scan[i];
    const int qcoeff = qcoeff_ptr[rc];
    if (qcoeff) {
      first = i;
      break;
    }
  }
  if ((*eob_ptr - 1) >= 0 && first == (*eob_ptr - 1)) {
    const int rc = scan[(*eob_ptr - 1)];
    if (qcoeff_ptr[rc] == 1 || qcoeff_ptr[rc] == -1) {
      const int coeff = coeff_ptr[rc] * wt;
      const int coeff_sign = AOMSIGN(coeff);
      const int abs_coeff = (coeff ^ coeff_sign) - coeff_sign;
      const int factor = EOB_FACTOR + SKIP_EOB_FACTOR_ADJUST;
      const int prescan_add_val =
          ROUND_POWER_OF_TWO(dequant_ptr[rc != 0] * factor, 7);
      if (abs_coeff <
          (zbin_ptr[rc != 0] * (1 << AOM_QM_BITS) + prescan_add_val)) {
        qcoeff_ptr[rc] = 0;
        dqcoeff_ptr[rc] = 0;
        *eob_ptr = 0;
      }
    }
  }
#endif
}